

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntConstantBounds.h
# Opt level: O1

IntConstantBounds __thiscall IntConstantBounds::And_0x1f(IntConstantBounds *this)

{
  IntConstantBounds IVar1;
  uint upperBound;
  uint lowerBound;
  IntConstantBounds local_10;
  
  if ((ulong)((long)this->upperBound - (long)this->lowerBound) < 0x1f) {
    lowerBound = this->lowerBound & 0x1f;
    upperBound = this->upperBound & 0x1f;
    if (lowerBound <= upperBound) {
      IntConstantBounds(&local_10,lowerBound,upperBound);
      return local_10;
    }
  }
  IVar1.lowerBound = 0;
  IVar1.upperBound = 0x1f;
  return IVar1;
}

Assistant:

IntConstantBounds And_0x1f() const
    {
        const int32 mask = 0x1f;
        if(static_cast<UIntConstType>(upperBound) - static_cast<UIntConstType>(lowerBound) >= static_cast<UIntConstType>(mask) ||
            (lowerBound & mask) > (upperBound & mask))
        {
            // The range contains all items in the set {0-mask}, or the range crosses a boundary of {0-mask}. Since we cannot
            // represent ranges like {0-5,8-mask}, just use {0-mask}.
            return IntConstantBounds(0, mask);
        }
        return IntConstantBounds(lowerBound & mask, upperBound & mask);
    }